

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::CmpInst::CmpInst(CmpInst *this,ValueKind kind,Predicate pred_,Value *LHS,Value *RHS)

{
  Type *pTVar1;
  LLVMContext *context;
  Value *local_58;
  Value *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pTVar1 = Value::getType(LHS);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getInt1Ty(context);
  Instruction::Instruction(&this->super_Instruction,pTVar1,kind);
  this->pred = pred_;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_58 = LHS;
  local_50 = RHS;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_48,
             &local_58);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_48);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_48);
  return;
}

Assistant:

CmpInst::CmpInst(ValueKind kind, Predicate pred_, Value *LHS, Value *RHS)
    : Instruction(Type::getInt1Ty(LHS->getType()->getContext()), kind)
    , pred(pred_)
{
	set_operands({ LHS, RHS });
}